

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O2

void FinishActor(FScriptPosition *sc,PClassActor *info,Baggage *bag)

{
  FStateDefinitions *this;
  AActor *defaults;
  DDropItem *pointed;
  bool bVar1;
  FState *pFVar2;
  FState *pFVar3;
  FState *pFVar4;
  FState *pFVar5;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  
  defaults = (AActor *)(info->super_PClass).Defaults;
  this = &bag->statedef;
  FStateDefinitions::FinishStates(this,info,defaults);
  FStateDefinitions::InstallStates(this,info,defaults);
  FStateDefinitions::MakeStateDefines(this,(PClassActor *)0x0);
  if (bag->DropItemSet == true) {
    pointed = bag->DropItemList;
    info->DropItems = pointed;
    if (((pointed != (DDropItem *)0x0) && (((pointed->super_DObject).ObjectFlags & 3) != 0)) &&
       (((info->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
         super_DObject.ObjectFlags & 4) != 0)) {
      GC::Barrier((DObject *)info,&pointed->super_DObject);
    }
  }
  bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&info->super_PClass);
  if (bVar1) {
    *(byte *)&(defaults->flags).Value = (byte)(defaults->flags).Value | 1;
  }
  bVar1 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,&info->super_PClass);
  if (bVar1) {
    local_34.Index = 0x9e;
    pFVar2 = PClassActor::FindState(info,&local_34);
    local_38.Index = 0x9b;
    pFVar3 = PClassActor::FindState(info,&local_38);
    local_3c.Index = 0x9c;
    pFVar4 = PClassActor::FindState(info,&local_3c);
    local_40.Index = 0x9f;
    pFVar5 = PClassActor::FindState(info,&local_40);
    if (((pFVar2 != (FState *)0x0 || pFVar3 != (FState *)0x0) || pFVar4 != (FState *)0x0) ||
        pFVar5 != (FState *)0x0) {
      if (pFVar2 == (FState *)0x0) {
        FScriptPosition::Message
                  (sc,2,"Weapon %s doesn\'t define a ready state.\n",
                   FName::NameData.NameArray
                   [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
      if (pFVar3 == (FState *)0x0) {
        FScriptPosition::Message
                  (sc,2,"Weapon %s doesn\'t define a select state.\n",
                   FName::NameData.NameArray
                   [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
      if (pFVar4 == (FState *)0x0) {
        FScriptPosition::Message
                  (sc,2,"Weapon %s doesn\'t define a deselect state.\n",
                   FName::NameData.NameArray
                   [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
      if (pFVar5 == (FState *)0x0) {
        FScriptPosition::Message
                  (sc,2,"Weapon %s doesn\'t define a fire state.\n",
                   FName::NameData.NameArray
                   [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
    }
  }
  return;
}

Assistant:

void FinishActor(const FScriptPosition &sc, PClassActor *info, Baggage &bag)
{
	AActor *defaults = (AActor*)info->Defaults;

	try
	{
		bag.statedef.FinishStates (info, defaults);
	}
	catch (CRecoverableError &err)
	{
		sc.Message(MSG_ERROR, "%s", err.GetMessage());
		bag.statedef.MakeStateDefines(NULL);
		return;
	}
	bag.statedef.InstallStates (info, defaults);
	bag.statedef.MakeStateDefines(NULL);
	if (bag.DropItemSet)
	{
		info->DropItems = bag.DropItemList;
		GC::WriteBarrier(info, info->DropItems);
	}
	if (info->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		defaults->flags |= MF_SPECIAL;
	}

	// Weapons must be checked for all relevant states. They may crash the game otherwise.
	if (info->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
	{
		FState *ready = info->FindState(NAME_Ready);
		FState *select = info->FindState(NAME_Select);
		FState *deselect = info->FindState(NAME_Deselect);
		FState *fire = info->FindState(NAME_Fire);

		// Consider any weapon without any valid state abstract and don't output a warning
		// This is for creating base classes for weapon groups that only set up some properties.
		if (ready || select || deselect || fire)
		{
			if (!ready)
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a ready state.\n", info->TypeName.GetChars());
			}
			if (!select) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a select state.\n", info->TypeName.GetChars());
			}
			if (!deselect) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a deselect state.\n", info->TypeName.GetChars());
			}
			if (!fire) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a fire state.\n", info->TypeName.GetChars());
			}
		}
	}
}